

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O3

TA_RetCode
TA_ACCBANDS_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                   int *outNBElement)

{
  TA_ParamHolderInput *pTVar1;
  TA_ParamHolderOutput *pTVar2;
  TA_RetCode TVar3;
  
  pTVar1 = params->in;
  pTVar2 = params->out;
  TVar3 = TA_ACCBANDS(startIdx,endIdx,(pTVar1->data).inPrice.high,(pTVar1->data).inPrice.low,
                      (pTVar1->data).inPrice.close,(params->optIn->data).optInInteger,outBegIdx,
                      outNBElement,(pTVar2->data).outReal,pTVar2[1].data.outReal,
                      pTVar2[2].data.outReal);
  return TVar3;
}

Assistant:

TA_RetCode TA_ACCBANDS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_ACCBANDS(
/* Generated */                  startIdx,
/* Generated */                  endIdx,
/* Generated */                  params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                  params->in[0].data.inPrice.low, /* inLow */
/* Generated */                  params->in[0].data.inPrice.close, /* inClose */
/* Generated */                  params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                  outBegIdx, 
/* Generated */                  outNBElement, 
/* Generated */                  params->out[0].data.outReal, /*  outRealUpperBand */
/* Generated */                  params->out[1].data.outReal, /*  outRealMiddleBand */
/* Generated */                  params->out[2].data.outReal /*  outRealLowerBand */ );
/* Generated */ }